

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O1

void ravi_dump_function(lua_State *L)

{
  lua_CFunction p_Var1;
  size_t len;
  int full;
  char *__assertion;
  membuff_t mb;
  membuff_t local_30;
  
  membuff_init(&local_30,0x1000);
  if (L->top[-1].tt_ == 0x8006) {
    p_Var1 = L->top[-1].value_.f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
      ravi_print_function(&local_30,*(Proto **)(p_Var1 + 0x18),full);
      len = strlen(local_30.buf);
      ravi_writestring(L,local_30.buf,len);
      membuff_free(&local_30);
      return;
    }
    __assertion = "(((L->top+(-1))->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    __assertion = "((((L->top+(-1)))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lopcodes.c"
                ,0x27a,"void ravi_dump_function(lua_State *)");
}

Assistant:

void ravi_dump_function(lua_State *L)
{
  Proto* f;
  membuff_t mb;

  membuff_init(&mb, 4096);
  f = toproto(L, -1);
  ravi_print_function(&mb, f, 1);
  ravi_writestring(L, mb.buf, strlen(mb.buf));
  membuff_free(&mb);
}